

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_pcm_rb_uninit(ma_pcm_rb *pRB)

{
  ma_pcm_rb *pRB_local;
  
  if (pRB != (ma_pcm_rb *)0x0) {
    ma_rb_uninit(&pRB->rb);
  }
  return;
}

Assistant:

MA_API void ma_pcm_rb_uninit(ma_pcm_rb* pRB)
{
    if (pRB == NULL) {
        return;
    }

    ma_rb_uninit(&pRB->rb);
}